

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTruth.c
# Opt level: O0

word Hop_ManComputeTruth6(Hop_Man_t *p,Hop_Obj_t *pObj,int nVars)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  Hop_Man_t *local_48;
  int local_34;
  int i;
  word Truth;
  int nVars_local;
  Hop_Obj_t *pObj_local;
  Hop_Man_t *p_local;
  
  pHVar2 = Hop_Regular(pObj);
  iVar1 = Hop_ObjIsConst1(pHVar2);
  if (iVar1 == 0) {
    for (local_34 = 0; local_34 < nVars; local_34 = local_34 + 1) {
      pHVar2 = Hop_ManPi(p,local_34);
      (pHVar2->field_0).iData = local_34;
    }
    pHVar2 = Hop_Regular(pObj);
    local_48 = (Hop_Man_t *)Hop_ManComputeTruth6_rec(p,pHVar2);
    iVar1 = Hop_IsComplement(pObj);
    if (iVar1 != 0) {
      local_48 = (Hop_Man_t *)((ulong)local_48 ^ 0xffffffffffffffff);
    }
    p_local = local_48;
  }
  else {
    iVar1 = Hop_IsComplement(pObj);
    p_local = (Hop_Man_t *)0xffffffffffffffff;
    if (iVar1 != 0) {
      p_local = (Hop_Man_t *)0x0;
    }
  }
  return (word)p_local;
}

Assistant:

word Hop_ManComputeTruth6( Hop_Man_t * p, Hop_Obj_t * pObj, int nVars )
{
    word Truth;
    int i;
    if ( Hop_ObjIsConst1( Hop_Regular(pObj) ) )
        return Hop_IsComplement(pObj) ? 0 : ~(word)0;
    for ( i = 0; i < nVars; i++ )
        Hop_ManPi( p, i )->iData = i;
    Truth = Hop_ManComputeTruth6_rec( p, Hop_Regular(pObj) );
    return Hop_IsComplement(pObj) ? ~Truth : Truth;
}